

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O1

void QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture,QGles2RenderBuffer>
               (QRhiTextureRenderTargetDescription *desc,ResIdList *dst)

{
  void *pvVar1;
  QRhiResource *pQVar2;
  void *pvVar3;
  QRhiTexture *this;
  QRhiRenderBuffer *this_00;
  bool bVar4;
  quint64 qVar5;
  undefined4 uVar6;
  int iVar7;
  undefined8 *puVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  QGles2RenderBuffer *depthRbD;
  QGles2Texture *texD;
  long lVar13;
  
  bVar4 = desc->m_depthTexture != (QRhiTexture *)0x0 ||
          desc->m_depthStencilBuffer != (QRhiRenderBuffer *)0x0;
  lVar13 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s * 2 +
           (ulong)bVar4;
  lVar9 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.a;
  if (lVar9 <= lVar13) {
    lVar9 = lVar13;
  }
  QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::reallocate_impl
            (&dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>,0x11,
             &dst->super_QVLAStorage<16UL,_8UL,_17LL>,lVar13,lVar9);
  (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.s = lVar13;
  lVar9 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s;
  if (lVar9 == 0) {
    uVar11 = 0;
  }
  else {
    pvVar1 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.ptr;
    lVar13 = 0;
    uVar10 = 0;
    puVar8 = (undefined8 *)((long)pvVar1 + 8);
    do {
      pQVar2 = (QRhiResource *)puVar8[-1];
      if (pQVar2 == (QRhiResource *)0x0) {
        pQVar2 = (QRhiResource *)*puVar8;
        if (pQVar2 == (QRhiResource *)0x0) {
          qVar5 = 0;
          uVar6 = 0;
        }
        else {
          qVar5 = QRhiResource::globalResourceId(pQVar2);
          uVar6 = (undefined4)pQVar2[1].m_objectName.d.size;
        }
      }
      else {
        qVar5 = QRhiResource::globalResourceId(pQVar2);
        uVar6 = *(undefined4 *)((long)&pQVar2[3].m_id + 4);
      }
      pvVar3 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.
               ptr;
      *(quint64 *)((long)pvVar3 + lVar13) = qVar5;
      *(undefined4 *)((long)pvVar3 + lVar13 + 8) = uVar6;
      pQVar2 = (QRhiResource *)puVar8[2];
      if (pQVar2 == (QRhiResource *)0x0) {
        qVar5 = 0;
        uVar6 = 0;
      }
      else {
        qVar5 = QRhiResource::globalResourceId(pQVar2);
        uVar6 = *(undefined4 *)((long)&pQVar2[3].m_id + 4);
      }
      pvVar3 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.
               ptr;
      *(quint64 *)((long)pvVar3 + lVar13 + 0x10) = qVar5;
      *(undefined4 *)((long)pvVar3 + lVar13 + 0x18) = uVar6;
      uVar10 = uVar10 + 2;
      lVar13 = lVar13 + 0x20;
      puVar12 = puVar8 + 5;
      puVar8 = puVar8 + 6;
    } while (puVar12 != (undefined8 *)(lVar9 * 0x30 + (long)pvVar1));
    uVar11 = (ulong)uVar10;
  }
  if (bVar4) {
    this = desc->m_depthTexture;
    if (this == (QRhiTexture *)0x0) {
      this_00 = desc->m_depthStencilBuffer;
      if (this_00 == (QRhiRenderBuffer *)0x0) {
        qVar5 = 0;
        iVar7 = 0;
      }
      else {
        qVar5 = QRhiResource::globalResourceId(&this_00->super_QRhiResource);
        iVar7 = (int)this_00[1].super_QRhiResource.m_id;
      }
    }
    else {
      qVar5 = QRhiResource::globalResourceId(&this->super_QRhiResource);
      iVar7 = this[1].m_depth;
    }
    pvVar1 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.ptr;
    *(quint64 *)((long)pvVar1 + uVar11 * 0x10) = qVar5;
    *(int *)((long)pvVar1 + uVar11 * 0x10 + 8) = iVar7;
  }
  return;
}

Assistant:

void QRhiRenderTargetAttachmentTracker::updateResIdList(const QRhiTextureRenderTargetDescription &desc, ResIdList *dst)
{
    const bool hasDepthStencil = desc.depthStencilBuffer() || desc.depthTexture();
    dst->resize(desc.colorAttachmentCount() * 2 + (hasDepthStencil ? 1 : 0));
    int n = 0;
    for (auto it = desc.cbeginColorAttachments(), itEnd = desc.cendColorAttachments(); it != itEnd; ++it, ++n) {
        const QRhiColorAttachment &colorAtt(*it);
        if (colorAtt.texture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.texture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else if (colorAtt.renderBuffer()) {
            RenderBufferType *rbD = QRHI_RES(RenderBufferType, colorAtt.renderBuffer());
            (*dst)[n] = { rbD->globalResourceId(), rbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
        ++n;
        if (colorAtt.resolveTexture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.resolveTexture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
    if (hasDepthStencil) {
        if (desc.depthTexture()) {
            TexType *depthTexD = QRHI_RES(TexType, desc.depthTexture());
            (*dst)[n] = { depthTexD->globalResourceId(), depthTexD->generation };
        } else if (desc.depthStencilBuffer()) {
            RenderBufferType *depthRbD = QRHI_RES(RenderBufferType, desc.depthStencilBuffer());
            (*dst)[n] = { depthRbD->globalResourceId(), depthRbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
}